

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

ImGuiTableSettings * ImGui::TableSettingsFindByID(ImGuiID id)

{
  char *pcVar1;
  ImGuiTableSettings *p;
  ImChunkStream<ImGuiTableSettings> *this;
  
  pcVar1 = (GImGui->SettingsTables).Buf.Data;
  this = &GImGui->SettingsTables;
  p = (ImGuiTableSettings *)(pcVar1 + 4);
  if (pcVar1 == (char *)0x0) {
    p = (ImGuiTableSettings *)0x0;
  }
  for (; (p != (ImGuiTableSettings *)0x0 && (p->ID != id));
      p = ImChunkStream<ImGuiTableSettings>::next_chunk(this,p)) {
  }
  return p;
}

Assistant:

ImGuiTableSettings* ImGui::TableSettingsFindByID(ImGuiID id)
{
    // FIXME-OPT: Might want to store a lookup map for this?
    ImGuiContext& g = *GImGui;
    for (ImGuiTableSettings* settings = g.SettingsTables.begin(); settings != NULL; settings = g.SettingsTables.next_chunk(settings))
        if (settings->ID == id)
            return settings;
    return NULL;
}